

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O1

bool __thiscall CoinStatsIndex::CustomAppend(CoinStatsIndex *this,BlockInfo *block)

{
  pointer pCVar1;
  CAmount *pCVar2;
  uchar *puVar3;
  undefined1 *puVar4;
  DataStream *this_00;
  int iVar5;
  uint256 *puVar6;
  pointer pCVar7;
  long lVar8;
  long lVar9;
  CDBWrapper *_parent;
  bool bVar10;
  uint uVar11;
  CChainParams *consensusParams;
  CAmount CVar12;
  CBlockIndex *index;
  uint256 **ppuVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint64_t *puVar16;
  undefined8 uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  element_type *peVar21;
  pointer psVar22;
  pointer pCVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Span<const_std::byte> key;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  ulong local_1d8;
  CBlockUndo block_undo;
  uint256 out;
  uint256 expected_block_hash;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  Coin coin;
  DataStream local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = block->height;
  consensusParams = Params();
  CVar12 = GetBlockSubsidy(iVar5,&consensusParams->consensus);
  this->m_total_subsidy = this->m_total_subsidy + CVar12;
  if (block->height < 1) {
    this->m_total_unspendable_amount = this->m_total_unspendable_amount + CVar12;
    this->m_total_unspendables_genesis_block = this->m_total_unspendables_genesis_block + CVar12;
LAB_0089bdd2:
    lVar24 = this->m_total_prevout_spent_amount;
    lVar26 = this->m_total_new_outputs_ex_coinbase_amount;
    lVar8 = this->m_total_coinbase_amount;
    lVar9 = this->m_total_subsidy;
    lVar19 = (lVar9 + lVar24) - (lVar26 + lVar8 + this->m_total_unspendable_amount);
    lVar25 = this->m_total_unspendable_amount + lVar19;
    this->m_total_unspendable_amount = lVar25;
    lVar19 = lVar19 + this->m_total_unspendables_unclaimed_rewards;
    this->m_total_unspendables_unclaimed_rewards = lVar19;
    memset(&read_out,0,0xa0);
    puVar6 = block->hash;
    read_out.first.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
    read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
    read_out.first.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
    read_out.first.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    read_out.second.transaction_output_count = this->m_transaction_output_count;
    read_out.second.bogo_size = this->m_bogo_size;
    read_out.second.total_amount = this->m_total_amount;
    read_out.second.total_unspendables_genesis_block = this->m_total_unspendables_genesis_block;
    read_out.second.total_unspendables_bip30 = this->m_total_unspendables_bip30;
    read_out.second.total_unspendables_scripts = this->m_total_unspendables_scripts;
    out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    read_out.second.total_subsidy = lVar9;
    read_out.second.total_unspendable_amount = lVar25;
    read_out.second.total_prevout_spent_amount = lVar24;
    read_out.second.total_new_outputs_ex_coinbase_amount = lVar26;
    read_out.second.total_coinbase_amount = lVar8;
    read_out.second.total_unspendables_unclaimed_rewards = lVar19;
    MuHash3072::Finalize(&this->m_muhash,&out);
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x10] =
         out.super_base_blob<256U>.m_data._M_elems[0x10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x11] =
         out.super_base_blob<256U>.m_data._M_elems[0x11];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x12] =
         out.super_base_blob<256U>.m_data._M_elems[0x12];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x13] =
         out.super_base_blob<256U>.m_data._M_elems[0x13];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x14] =
         out.super_base_blob<256U>.m_data._M_elems[0x14];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x15] =
         out.super_base_blob<256U>.m_data._M_elems[0x15];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x16] =
         out.super_base_blob<256U>.m_data._M_elems[0x16];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x17] =
         out.super_base_blob<256U>.m_data._M_elems[0x17];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x18] =
         out.super_base_blob<256U>.m_data._M_elems[0x18];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x19] =
         out.super_base_blob<256U>.m_data._M_elems[0x19];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         out.super_base_blob<256U>.m_data._M_elems[0x1a];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         out.super_base_blob<256U>.m_data._M_elems[0x1b];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         out.super_base_blob<256U>.m_data._M_elems[0x1c];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         out.super_base_blob<256U>.m_data._M_elems[0x1d];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         out.super_base_blob<256U>.m_data._M_elems[0x1e];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         out.super_base_blob<256U>.m_data._M_elems[0x1f];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0] =
         out.super_base_blob<256U>.m_data._M_elems[0];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[1] =
         out.super_base_blob<256U>.m_data._M_elems[1];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[2] =
         out.super_base_blob<256U>.m_data._M_elems[2];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[3] =
         out.super_base_blob<256U>.m_data._M_elems[3];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[4] =
         out.super_base_blob<256U>.m_data._M_elems[4];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[5] =
         out.super_base_blob<256U>.m_data._M_elems[5];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[6] =
         out.super_base_blob<256U>.m_data._M_elems[6];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[7] =
         out.super_base_blob<256U>.m_data._M_elems[7];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[8] =
         out.super_base_blob<256U>.m_data._M_elems[8];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[9] =
         out.super_base_blob<256U>.m_data._M_elems[9];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[10] =
         out.super_base_blob<256U>.m_data._M_elems[10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xb] =
         out.super_base_blob<256U>.m_data._M_elems[0xb];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xc] =
         out.super_base_blob<256U>.m_data._M_elems[0xc];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xd] =
         out.super_base_blob<256U>.m_data._M_elems[0xd];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xe] =
         out.super_base_blob<256U>.m_data._M_elems[0xe];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xf] =
         out.super_base_blob<256U>.m_data._M_elems[0xf];
    _parent = &((this->m_db)._M_t.
                super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper;
    iVar5 = block->height;
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar5;
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((uint)iVar5 >> 8);
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((uint)iVar5 >> 0x10);
    expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((uint)iVar5 >> 0x18);
    CDBBatch::CDBBatch((CDBBatch *)&coin,_parent);
    this_00 = (DataStream *)((long)&coin.out.scriptPubKey.super_CScriptBase._union + 8);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)this_00,
               coin._40_8_ + 0x40);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              (&local_68.vch,local_68.m_read_pos + 0x400);
    DataStream::operator<<(this_00,(DBHeightKey *)&expected_block_hash);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_68,
               local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&read_out,&read_out.second);
    Serialize<DataStream,_(anonymous_namespace)::DBVal>(&local_68,&read_out.second);
    key.m_data = (byte *)(CONCAT17(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xf],
                                   CONCAT16(coin.out.scriptPubKey.super_CScriptBase._union.direct
                                            [0xe],CONCAT15(coin.out.scriptPubKey.super_CScriptBase.
                                                           _union.direct[0xd],
                                                           CONCAT14(coin.out.scriptPubKey.
                                                                    super_CScriptBase._union.direct
                                                                    [0xc],CONCAT13(coin.out.
                                                  scriptPubKey.super_CScriptBase._union.direct[0xb],
                                                  CONCAT12(coin.out.scriptPubKey.super_CScriptBase.
                                                           _union.direct[10],
                                                           CONCAT11(coin.out.scriptPubKey.
                                                                    super_CScriptBase._union.direct
                                                                    [9],coin.out.scriptPubKey.
                                                                        super_CScriptBase._union.
                                                                        direct[8]))))))) +
                         coin._40_8_);
    key.m_size = coin.out.scriptPubKey.super_CScriptBase._union._16_8_ - (long)key.m_data;
    CDBBatch::WriteImpl((CDBBatch *)&coin,key,&local_68);
    lVar24 = CONCAT17(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xf],
                      CONCAT16(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xe],
                               CONCAT15(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xd],
                                        CONCAT14(coin.out.scriptPubKey.super_CScriptBase._union.
                                                 direct[0xc],
                                                 CONCAT13(coin.out.scriptPubKey.super_CScriptBase.
                                                          _union.direct[0xb],
                                                          CONCAT12(coin.out.scriptPubKey.
                                                                   super_CScriptBase._union.direct
                                                                   [10],CONCAT11(coin.out.
                                                  scriptPubKey.super_CScriptBase._union.direct[9],
                                                  coin.out.scriptPubKey.super_CScriptBase._union.
                                                  direct[8])))))));
    if (coin.out.scriptPubKey.super_CScriptBase._union._16_8_ != lVar24) {
      coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = lVar24;
    }
    coin._40_8_ = 0;
    if (local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_68.m_read_pos = 0;
    bVar10 = CDBWrapper::WriteBatch(_parent,(CDBBatch *)&coin,false);
    CDBBatch::~CDBBatch((CDBBatch *)&coin);
  }
  else {
    read_out.first.super_base_blob<256U>.m_data._M_elems._0_8_ = &cs_main;
    read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
         read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&read_out);
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,block->hash);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&read_out);
    bVar10 = ::node::BlockManager::UndoReadFromDisk
                       (((this->super_BaseIndex).m_chainstate)->m_blockman,&block_undo,index);
    if (bVar10) {
      memset(&read_out,0,0xa0);
      coin.out.nValue = CONCAT44(coin.out.nValue._4_4_,block->height + -1);
      bVar10 = CDBWrapper::
               Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                         (&((this->m_db)._M_t.
                            super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                            .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                           super_CDBWrapper,(DBHeightKey *)&coin,&read_out);
      if (bVar10) {
        ppuVar13 = inline_assertion_check<true,uint256_const*const&>
                             (&block->prev_hash,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
                              ,0x87,"CustomAppend","block.prev_hash");
        puVar6 = *ppuVar13;
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[1];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[2];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[3];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[4];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[5];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[6];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[7];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[8];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[9];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[10];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0xb];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0xc];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0xd];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0xe];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0xf];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x10];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x11];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x12];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x13];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x14];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x15];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x16];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x17];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x18];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x19];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1a];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1b];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1c];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1d];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1e];
        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (puVar6->super_base_blob<256U>).m_data._M_elems[0x1f];
        auVar27[0] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[0]);
        auVar27[1] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[1]);
        auVar27[2] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[2]);
        auVar27[3] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[3]);
        auVar27[4] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[4]);
        auVar27[5] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[5]);
        auVar27[6] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[6]);
        auVar27[7] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[7]);
        auVar27[8] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[8]);
        auVar27[9] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      read_out.first.super_base_blob<256U>.m_data._M_elems[9]);
        auVar27[10] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       read_out.first.super_base_blob<256U>.m_data._M_elems[10]);
        auVar27[0xb] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar27[0xc] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar27[0xd] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar27[0xe] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar27[0xf] = -(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        read_out.first.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar28[0] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar28[1] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar28[2] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar28[3] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar28[4] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar28[5] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar28[6] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar28[7] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar28[8] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar28[9] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar28[10] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar28[0xb] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar28[0xc] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar28[0xd] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar28[0xe] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar28[0xf] = -(read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar27 = auVar27 & auVar28;
        if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&coin,&read_out);
          base_blob<256u>::ToString_abi_cxx11_((string *)&out,&expected_block_hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
          ;
          source_file._M_len = 0x68;
          logging_function._M_str = "CustomAppend";
          logging_function._M_len = 0xc;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x8a,ALL,Info,(ConstevalFormatString<2U>)0xf92c69,
                     (string *)&coin,(string *)&out);
          if ((uchar *)out.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              out.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)out.super_base_blob<256U>.m_data._M_elems._0_8_,
                            out.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
          puVar4 = (undefined1 *)((long)&coin.out.scriptPubKey.super_CScriptBase._union + 8);
          if ((undefined1 *)coin.out.nValue != puVar4) {
            operator_delete((void *)coin.out.nValue,
                            CONCAT17(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xf],
                                     CONCAT16(coin.out.scriptPubKey.super_CScriptBase._union.direct
                                              [0xe],CONCAT15(coin.out.scriptPubKey.super_CScriptBase
                                                             ._union.direct[0xd],
                                                             CONCAT14(coin.out.scriptPubKey.
                                                                      super_CScriptBase._union.
                                                                      direct[0xc],
                                                                      CONCAT13(coin.out.scriptPubKey
                                                                               .super_CScriptBase.
                                                                               _union.direct[0xb],
                                                                               CONCAT12(coin.out.
                                                  scriptPubKey.super_CScriptBase._union.direct[10],
                                                  CONCAT11(coin.out.scriptPubKey.super_CScriptBase.
                                                           _union.direct[9],
                                                           coin.out.scriptPubKey.super_CScriptBase.
                                                           _union.direct[8]))))))) + 1);
          }
          coin.out.nValue =
               CONCAT17(expected_block_hash.super_base_blob<256U>.m_data._M_elems[7],
                        CONCAT16(expected_block_hash.super_base_blob<256U>.m_data._M_elems[6],
                                 CONCAT15(expected_block_hash.super_base_blob<256U>.m_data._M_elems
                                          [5],CONCAT14(expected_block_hash.super_base_blob<256U>.
                                                       m_data._M_elems[4],
                                                       CONCAT13(expected_block_hash.
                                                                super_base_blob<256U>.m_data.
                                                                _M_elems[3],
                                                                CONCAT12(expected_block_hash.
                                                                         super_base_blob<256U>.
                                                                         m_data._M_elems[2],
                                                                         CONCAT11(
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[1],
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[0])))))));
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)CONCAT17(expected_block_hash.super_base_blob<256U>.m_data._M_elems[0xf],
                                CONCAT16(expected_block_hash.super_base_blob<256U>.m_data._M_elems
                                         [0xe],CONCAT15(expected_block_hash.super_base_blob<256U>.
                                                        m_data._M_elems[0xd],
                                                        CONCAT14(expected_block_hash.
                                                                 super_base_blob<256U>.m_data.
                                                                 _M_elems[0xc],
                                                                 CONCAT13(expected_block_hash.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0xb],
                                                                          CONCAT12(
                                                  expected_block_hash.super_base_blob<256U>.m_data.
                                                  _M_elems[10],
                                                  CONCAT11(expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[9],
                                                           expected_block_hash.super_base_blob<256U>
                                                           .m_data._M_elems[8])))))));
          coin.out.scriptPubKey.super_CScriptBase._union.direct[8] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[9] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[10] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0xb] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0xc] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0xd] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0xe] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0xf] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x11] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x10] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x12] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x13] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x14] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x15] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x16] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
          coin.out.scriptPubKey.super_CScriptBase._union.direct[0x17] =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
          bVar10 = CDBWrapper::
                   Read<(anonymous_namespace)::DBHashKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                             (&((this->m_db)._M_t.
                                super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                                .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                               super_CDBWrapper,(DBHashKey *)&coin,&read_out);
          if (!bVar10) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&coin,&expected_block_hash);
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
            ;
            source_file_00._M_len = 0x68;
            logging_function_00._M_str = "CustomAppend";
            logging_function_00._M_len = 0xc;
            LogPrintFormatInternal<char[13],std::__cxx11::string>
                      (logging_function_00,source_file_00,0x8e,ALL,Error,
                       (ConstevalFormatString<2U>)0xf92cb5,(char (*) [13])"CustomAppend",
                       (string *)&coin);
            if ((undefined1 *)coin.out.nValue != puVar4) {
              operator_delete((void *)coin.out.nValue,
                              CONCAT17(coin.out.scriptPubKey.super_CScriptBase._union.direct[0xf],
                                       CONCAT16(coin.out.scriptPubKey.super_CScriptBase._union.
                                                direct[0xe],
                                                CONCAT15(coin.out.scriptPubKey.super_CScriptBase.
                                                         _union.direct[0xd],
                                                         CONCAT14(coin.out.scriptPubKey.
                                                                  super_CScriptBase._union.direct
                                                                  [0xc],CONCAT13(coin.out.
                                                  scriptPubKey.super_CScriptBase._union.direct[0xb],
                                                  CONCAT12(coin.out.scriptPubKey.super_CScriptBase.
                                                           _union.direct[10],
                                                           CONCAT11(coin.out.scriptPubKey.
                                                                    super_CScriptBase._union.direct
                                                                    [9],coin.out.scriptPubKey.
                                                                        super_CScriptBase._union.
                                                                        direct[8]))))))) + 1);
            }
            goto LAB_0089c079;
          }
        }
        if (block->data == (CBlock *)0x0) {
LAB_0089c0d5:
          __assert_fail("block.data",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
                        ,0x94,
                        "virtual bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo &)");
        }
        psVar22 = (block->data->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((block->data->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar22) {
          local_1d8 = 0;
          do {
            bVar10 = IsBIP30Unspendable(index);
            psVar22 = psVar22 + local_1d8;
            if ((bVar10) &&
               (bVar10 = CTransaction::IsCoinBase
                                   ((psVar22->
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr), bVar10)) {
              this->m_total_unspendable_amount = this->m_total_unspendable_amount + CVar12;
              this->m_total_unspendables_bip30 = this->m_total_unspendables_bip30 + CVar12;
            }
            else {
              peVar21 = (psVar22->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              pCVar23 = (peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish != pCVar23) {
                uVar18 = 1;
                uVar20 = 0;
                do {
                  iVar5 = block->height;
                  bVar10 = CTransaction::IsCoinBase
                                     ((psVar22->
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
                  coin.out.nValue = *(CAmount *)((long)(&pCVar23[uVar20].scriptPubKey + -1) + 0x18);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                            (&coin.out.scriptPubKey.super_CScriptBase,
                             &pCVar23[uVar20].scriptPubKey.super_CScriptBase);
                  coin._40_4_ = (uint)bVar10 + iVar5 * 2;
                  peVar21 = (psVar22->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  out.super_base_blob<256U>.m_data._M_elems._0_8_ =
                       *(undefined8 *)
                        (peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                  out.super_base_blob<256U>.m_data._M_elems._8_8_ =
                       *(undefined8 *)
                        ((long)(peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                  out.super_base_blob<256U>.m_data._M_elems._16_8_ =
                       *(undefined8 *)
                        ((long)(peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
                  out.super_base_blob<256U>.m_data._M_elems._24_8_ =
                       *(undefined8 *)
                        ((long)(peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
                  uVar11 = coin.out.scriptPubKey.super_CScriptBase._size - 0x1d;
                  if (coin.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
                    uVar11 = coin.out.scriptPubKey.super_CScriptBase._size;
                  }
                  if (uVar11 == 0) {
LAB_0089bb66:
                    kernel::ApplyCoinHash(&this->m_muhash,(COutPoint *)&out,&coin);
                    bVar10 = CTransaction::IsCoinBase
                                       ((psVar22->
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr);
                    (&this->m_total_new_outputs_ex_coinbase_amount)[bVar10] =
                         (&this->m_total_new_outputs_ex_coinbase_amount)[bVar10] + coin.out.nValue;
                    this->m_transaction_output_count = this->m_transaction_output_count + 1;
                    this->m_total_amount = this->m_total_amount + coin.out.nValue;
                    uVar14 = kernel::GetBogoSize(&coin.out.scriptPubKey);
                    puVar16 = &this->m_bogo_size;
                  }
                  else {
                    uVar17 = &coin.out.scriptPubKey;
                    if (0x1c < coin.out.scriptPubKey.super_CScriptBase._size) {
                      uVar17 = coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                               indirect;
                    }
                    if ((uVar11 < 0x2711) &&
                       ((((CScript *)uVar17)->super_CScriptBase)._union.direct[0] != 'j'))
                    goto LAB_0089bb66;
                    this->m_total_unspendable_amount =
                         this->m_total_unspendable_amount + coin.out.nValue;
                    uVar14 = coin.out.nValue;
                    puVar16 = (uint64_t *)&this->m_total_unspendables_scripts;
                  }
                  *puVar16 = *puVar16 + uVar14;
                  if (0x1c < coin.out.scriptPubKey.super_CScriptBase._size) {
                    free(coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
                    coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                         (char *)0x0;
                  }
                  uVar20 = (ulong)uVar18;
                  peVar21 = (psVar22->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  pCVar23 = (peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar15 = ((long)(peVar21->vout).
                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pCVar23 >> 3) *
                           -0x3333333333333333;
                  uVar18 = uVar18 + 1;
                } while (uVar20 <= uVar15 && uVar15 - uVar20 != 0);
              }
              bVar10 = CTransaction::IsCoinBase(peVar21);
              if (!bVar10) {
                uVar20 = local_1d8 - 1;
                uVar15 = ((long)block_undo.vtxundo.
                                super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)block_undo.vtxundo.
                                super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
                if (uVar15 < uVar20 || uVar15 - uVar20 == 0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0089c23a;
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_0089c0d5;
                }
                if (block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar20].vprevout.
                    super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
                    _M_finish !=
                    block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar20].vprevout.
                    super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
                    _M_start) {
                  pCVar1 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar20;
                  lVar26 = 0x20;
                  lVar24 = 0;
                  uVar20 = 0;
                  do {
                    pCVar7 = (pCVar1->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    pCVar2 = (CAmount *)((long)&(pCVar7->out).nValue + lVar24);
                    coin.out.nValue = *pCVar2;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                              (&coin.out.scriptPubKey.super_CScriptBase,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(pCVar2 + 1));
                    coin._40_4_ = *(undefined4 *)(&pCVar7->field_0x28 + lVar24);
                    lVar8 = (long)(((psVar22->
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->vin).
                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                    puVar3 = (uchar *)(lVar8 + -0x20 + lVar26);
                    out.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar3;
                    out.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 8);
                    puVar3 = (uchar *)(lVar8 + -0x10 + lVar26);
                    out.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar3;
                    out.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 8);
                    kernel::RemoveCoinHash(&this->m_muhash,(COutPoint *)&out,&coin);
                    this->m_total_prevout_spent_amount =
                         this->m_total_prevout_spent_amount + coin.out.nValue;
                    this->m_transaction_output_count = this->m_transaction_output_count - 1;
                    this->m_total_amount = this->m_total_amount - coin.out.nValue;
                    uVar14 = kernel::GetBogoSize(&coin.out.scriptPubKey);
                    this->m_bogo_size = this->m_bogo_size - uVar14;
                    if (0x1c < coin.out.scriptPubKey.super_CScriptBase._size) {
                      free(coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                          );
                      coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                           (char *)0x0;
                    }
                    uVar20 = uVar20 + 1;
                    lVar24 = lVar24 + 0x30;
                    lVar26 = lVar26 + 0x68;
                  } while (uVar20 < (ulong)(((long)(pCVar1->vprevout).
                                                   super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                             (long)(pCVar1->vprevout).
                                                   super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                   _M_impl.super__Vector_impl_data._M_start >> 4) *
                                           -0x5555555555555555));
                }
              }
            }
            local_1d8 = local_1d8 + 1;
            psVar22 = (block->data->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (local_1d8 <
                   (ulong)((long)(block->data->vtx).
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar22 >> 4));
        }
        goto LAB_0089bdd2;
      }
    }
LAB_0089c079:
    bVar10 = false;
  }
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
LAB_0089c23a:
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;
    const CAmount block_subsidy{GetBlockSubsidy(block.height, Params().GetConsensus())};
    m_total_subsidy += block_subsidy;

    // Ignore genesis block
    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }

        std::pair<uint256, DBVal> read_out;
        if (!m_db->Read(DBHeightKey(block.height - 1), read_out)) {
            return false;
        }

        uint256 expected_block_hash{*Assert(block.prev_hash)};
        if (read_out.first != expected_block_hash) {
            LogPrintf("WARNING: previous block header belongs to unexpected block %s; expected %s\n",
                      read_out.first.ToString(), expected_block_hash.ToString());

            if (!m_db->Read(DBHashKey(expected_block_hash), read_out)) {
                LogError("%s: previous block header not found; expected %s\n",
                             __func__, expected_block_hash.ToString());
                return false;
            }
        }

        // Add the new utxos created from the block
        assert(block.data);
        for (size_t i = 0; i < block.data->vtx.size(); ++i) {
            const auto& tx{block.data->vtx.at(i)};

            // Skip duplicate txid coinbase transactions (BIP30).
            if (IsBIP30Unspendable(*pindex) && tx->IsCoinBase()) {
                m_total_unspendable_amount += block_subsidy;
                m_total_unspendables_bip30 += block_subsidy;
                continue;
            }

            for (uint32_t j = 0; j < tx->vout.size(); ++j) {
                const CTxOut& out{tx->vout[j]};
                Coin coin{out, block.height, tx->IsCoinBase()};
                COutPoint outpoint{tx->GetHash(), j};

                // Skip unspendable coins
                if (coin.out.scriptPubKey.IsUnspendable()) {
                    m_total_unspendable_amount += coin.out.nValue;
                    m_total_unspendables_scripts += coin.out.nValue;
                    continue;
                }

                ApplyCoinHash(m_muhash, outpoint, coin);

                if (tx->IsCoinBase()) {
                    m_total_coinbase_amount += coin.out.nValue;
                } else {
                    m_total_new_outputs_ex_coinbase_amount += coin.out.nValue;
                }

                ++m_transaction_output_count;
                m_total_amount += coin.out.nValue;
                m_bogo_size += GetBogoSize(coin.out.scriptPubKey);
            }

            // The coinbase tx has no undo data since no former output is spent
            if (!tx->IsCoinBase()) {
                const auto& tx_undo{block_undo.vtxundo.at(i - 1)};

                for (size_t j = 0; j < tx_undo.vprevout.size(); ++j) {
                    Coin coin{tx_undo.vprevout[j]};
                    COutPoint outpoint{tx->vin[j].prevout.hash, tx->vin[j].prevout.n};

                    RemoveCoinHash(m_muhash, outpoint, coin);

                    m_total_prevout_spent_amount += coin.out.nValue;

                    --m_transaction_output_count;
                    m_total_amount -= coin.out.nValue;
                    m_bogo_size -= GetBogoSize(coin.out.scriptPubKey);
                }
            }
        }
    } else {
        // genesis block
        m_total_unspendable_amount += block_subsidy;
        m_total_unspendables_genesis_block += block_subsidy;
    }

    // If spent prevouts + block subsidy are still a higher amount than
    // new outputs + coinbase + current unspendable amount this means
    // the miner did not claim the full block reward. Unclaimed block
    // rewards are also unspendable.
    const CAmount unclaimed_rewards{(m_total_prevout_spent_amount + m_total_subsidy) - (m_total_new_outputs_ex_coinbase_amount + m_total_coinbase_amount + m_total_unspendable_amount)};
    m_total_unspendable_amount += unclaimed_rewards;
    m_total_unspendables_unclaimed_rewards += unclaimed_rewards;

    std::pair<uint256, DBVal> value;
    value.first = block.hash;
    value.second.transaction_output_count = m_transaction_output_count;
    value.second.bogo_size = m_bogo_size;
    value.second.total_amount = m_total_amount;
    value.second.total_subsidy = m_total_subsidy;
    value.second.total_unspendable_amount = m_total_unspendable_amount;
    value.second.total_prevout_spent_amount = m_total_prevout_spent_amount;
    value.second.total_new_outputs_ex_coinbase_amount = m_total_new_outputs_ex_coinbase_amount;
    value.second.total_coinbase_amount = m_total_coinbase_amount;
    value.second.total_unspendables_genesis_block = m_total_unspendables_genesis_block;
    value.second.total_unspendables_bip30 = m_total_unspendables_bip30;
    value.second.total_unspendables_scripts = m_total_unspendables_scripts;
    value.second.total_unspendables_unclaimed_rewards = m_total_unspendables_unclaimed_rewards;

    uint256 out;
    m_muhash.Finalize(out);
    value.second.muhash = out;

    // Intentionally do not update DB_MUHASH here so it stays in sync with
    // DB_BEST_BLOCK, and the index is not corrupted if there is an unclean shutdown.
    return m_db->Write(DBHeightKey(block.height), value);
}